

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::init
          (Texture3DFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  Texture3D *pTVar2;
  RenderContext *pRVar3;
  Texture3D *pTVar4;
  PixelBufferAccess *pPVar5;
  Vector<float,_3> local_248;
  Vector<float,_3> local_23c;
  FilterCase local_230;
  Vector<float,_3> local_210;
  Vector<float,_3> local_204;
  FilterCase local_1f8;
  Vector<float,_3> local_1d8;
  Vector<float,_3> local_1cc;
  FilterCase local_1c0;
  Vector<float,_3> local_1a0;
  Vector<float,_3> local_194;
  FilterCase local_188;
  RGBA local_168;
  Vector<float,_4> local_164;
  Vector<float,_4> local_154;
  Vec4 local_144;
  RGBA local_134;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vec4 local_110;
  uint local_100;
  uint local_fc;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  Vector<float,_4> local_dc;
  undefined1 local_cc [8];
  Vec4 gMax;
  Vector<float,_4> local_ac;
  undefined1 local_9c [8];
  Vec4 gMin;
  int levelNdx;
  int numLevels;
  Vec4 cBias;
  Vec4 cScale;
  TextureFormatInfo fmtInfo;
  TextureFormat local_18;
  TextureFormat texFmt;
  Texture3DFilteringCase *this_local;
  
  texFmt = (TextureFormat)this;
  local_18 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo((TextureFormatInfo *)(cScale.m_data + 2),&local_18);
  tcu::operator-((tcu *)(cBias.m_data + 2),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)(cScale.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&levelNdx,(Vector<float,_4> *)(cScale.m_data + 2));
  iVar1 = de::max<int>(this->m_width,this->m_height);
  iVar1 = de::max<int>(iVar1,this->m_depth);
  iVar1 = deLog2Floor32(iVar1);
  gMin.m_data[3] = (float)(iVar1 + 1);
  pTVar2 = (Texture3D *)operator_new(0x70);
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture3D::Texture3D
            (pTVar2,pRVar3,this->m_internalFormat,this->m_width,this->m_height,this->m_depth);
  this->m_gradientTex = pTVar2;
  pTVar2 = (Texture3D *)operator_new(0x70);
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture3D::Texture3D
            (pTVar2,pRVar3,this->m_internalFormat,this->m_width,this->m_height,this->m_depth);
  this->m_gridTex = pTVar2;
  for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < (int)gMin.m_data[3];
      gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),0.0,0.0,0.0,1.0);
    tcu::operator*((tcu *)&local_ac,(Vector<float,_4> *)(gMax.m_data + 2),
                   (Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator+((tcu *)local_9c,&local_ac,(Vector<float,_4> *)&levelNdx);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&step,1.0,1.0,1.0,0.0);
    tcu::operator*((tcu *)&local_dc,(Vector<float,_4> *)&step,(Vector<float,_4> *)(cBias.m_data + 2)
                  );
    tcu::operator+((tcu *)local_cc,&local_dc,(Vector<float,_4> *)&levelNdx);
    pTVar4 = glu::Texture3D::getRefTexture(this->m_gradientTex);
    tcu::Texture3D::allocLevel(pTVar4,(int)gMin.m_data[2]);
    pTVar4 = glu::Texture3D::getRefTexture(this->m_gradientTex);
    pPVar5 = tcu::TextureLevelPyramid::getLevel
                       (&pTVar4->super_TextureLevelPyramid,(int)gMin.m_data[2]);
    tcu::fillWithComponentGradients(pPVar5,(Vec4 *)local_9c,(Vec4 *)local_cc);
  }
  for (rgb = 0; (int)rgb < (int)gMin.m_data[3]; rgb = rgb + 1) {
    colorA = (deUint32)(0xffffff / (long)(int)gMin.m_data[3]);
    colorB = colorA * rgb;
    local_fc = colorB | 0xff000000;
    local_100 = ~colorB | 0xff000000;
    pTVar4 = glu::Texture3D::getRefTexture(this->m_gridTex);
    tcu::Texture3D::allocLevel(pTVar4,rgb);
    pTVar4 = glu::Texture3D::getRefTexture(this->m_gridTex);
    pPVar5 = tcu::TextureLevelPyramid::getLevel(&pTVar4->super_TextureLevelPyramid,rgb);
    tcu::RGBA::RGBA(&local_134,local_fc);
    tcu::RGBA::toVec((RGBA *)&local_130);
    tcu::operator*((tcu *)&local_120,&local_130,(Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator+((tcu *)&local_110,&local_120,(Vector<float,_4> *)&levelNdx);
    tcu::RGBA::RGBA(&local_168,local_100);
    tcu::RGBA::toVec((RGBA *)&local_164);
    tcu::operator*((tcu *)&local_154,&local_164,(Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator+((tcu *)&local_144,&local_154,(Vector<float,_4> *)&levelNdx);
    tcu::fillWithGrid(pPVar5,4,&local_110,&local_144);
  }
  glu::Texture3D::upload(this->m_gradientTex);
  glu::Texture3D::upload(this->m_gridTex);
  pTVar2 = this->m_gradientTex;
  tcu::Vector<float,_3>::Vector(&local_194,1.5,2.8,1.0);
  tcu::Vector<float,_3>::Vector(&local_1a0,-1.0,-2.7,-2.275);
  FilterCase::FilterCase(&local_188,pTVar2,&local_194,&local_1a0);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_188);
  pTVar2 = this->m_gradientTex;
  tcu::Vector<float,_3>::Vector(&local_1cc,-2.0,-1.5,-1.8);
  tcu::Vector<float,_3>::Vector(&local_1d8,-0.1,0.9,-0.25);
  FilterCase::FilterCase(&local_1c0,pTVar2,&local_1cc,&local_1d8);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_1c0);
  pTVar2 = this->m_gridTex;
  tcu::Vector<float,_3>::Vector(&local_204,0.2,0.175,0.3);
  tcu::Vector<float,_3>::Vector(&local_210,-2.0,-3.7,-1.825);
  FilterCase::FilterCase(&local_1f8,pTVar2,&local_204,&local_210);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_1f8);
  pTVar2 = this->m_gridTex;
  tcu::Vector<float,_3>::Vector(&local_23c,-0.8,-2.3,-2.5);
  tcu::Vector<float,_3>::Vector(&local_248,0.2,-0.1,1.325);
  FilterCase::FilterCase(&local_230,pTVar2,&local_23c,&local_248);
  std::
  vector<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_230);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void Texture3DFilteringCase::init (void)
{
	try
	{
		const tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_internalFormat);
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		const tcu::Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;
		const tcu::Vec4					cBias		= fmtInfo.valueMin;
		const int						numLevels	= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth)) + 1;

		// Create textures.
		m_gradientTex	= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);
		m_gridTex		= new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

		// Fill first gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			tcu::Vec4 gMin = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			tcu::Vec4 gMax = tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)*cScale + cBias;

			m_gradientTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step	= 0x00ffffff / numLevels;
			deUint32	rgb		= step*levelNdx;
			deUint32	colorA	= 0xff000000 | rgb;
			deUint32	colorB	= 0xff000000 | ~rgb;

			m_gridTex->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_gridTex->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();

		// Test cases
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(1.5f, 2.8f, 1.0f),	tcu::Vec3(-1.0f, -2.7f, -2.275f)));
		m_cases.push_back(FilterCase(m_gradientTex,	tcu::Vec3(-2.0f, -1.5f, -1.8f),	tcu::Vec3(-0.1f, 0.9f, -0.25f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(0.2f, 0.175f, 0.3f),	tcu::Vec3(-2.0f, -3.7f, -1.825f)));
		m_cases.push_back(FilterCase(m_gridTex,		tcu::Vec3(-0.8f, -2.3f, -2.5f),	tcu::Vec3(0.2f, -0.1f, 1.325f)));

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		Texture3DFilteringCase::deinit();
		throw;
	}
}